

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BigInt.h
# Opt level: O1

BigInt * random_bigint(BigInt *__return_storage_ptr__,int n)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  string s;
  string local_40;
  
  paVar1 = &local_40.field_2;
  local_40._M_string_length = 0;
  local_40.field_2._M_local_buf[0] = '\0';
  local_40._M_dataplus._M_p = (pointer)paVar1;
  if (0 < n) {
    do {
      std::uniform_int_distribution<int>::operator()(dis,gen,&dis->_M_param);
      std::__cxx11::string::push_back((char)&local_40);
      n = n + -1;
    } while (n != 0);
  }
  BigInt::BigInt(__return_storage_ptr__,&local_40);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_40._M_dataplus._M_p != paVar1) {
    operator_delete(local_40._M_dataplus._M_p);
  }
  return __return_storage_ptr__;
}

Assistant:

BigInt random_bigint(int n) {
    string s;
    for (int i = 0; i < n; i++)
        s += (*dis)(*gen) % 10 + '0';

    return BigInt(s);
}